

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O1

void __thiscall
TApp_AddingComplexParser_Test::~TApp_AddingComplexParser_Test(TApp_AddingComplexParser_Test *this)

{
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_00152dd0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_TApp).args);
  CLI::App::~App(&(this->super_TApp).app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, AddingComplexParser) {

    cx comp{0, 0};
    add_option(app, "-c,--complex", comp);
    args = {"-c", "1.5", "2.5"};

    run();

    EXPECT_EQ(1.5, comp.real());
    EXPECT_EQ(2.5, comp.imag());
}